

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

SubArchType parseSubArch(StringRef SubArchName)

{
  ArchKind AVar1;
  SubArchType SVar2;
  SubArchType *pSVar3;
  size_t in_RDX;
  ARM *this;
  StringRef Arch;
  StringRef Arch_00;
  Optional<llvm::Triple::SubArchType> local_18;
  
  Arch.Data = (char *)SubArchName.Length;
  this = (ARM *)SubArchName.Data;
  Arch.Length = in_RDX;
  Arch_00 = llvm::ARM::getCanonicalArchName(this,Arch);
  if (Arch_00.Length == 0) {
    SVar2 = NoSubArch;
    if ((char *)0x7 < Arch.Data) {
      if (*(long *)(this + -8 + (long)Arch.Data) == 0x3361626d696c616b) {
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x16';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      }
      else {
        if (Arch.Data < (char *)0x8) {
          return NoSubArch;
        }
        if (*(long *)(this + -8 + (long)Arch.Data) == 0x3461626d696c616b) {
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x17';
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
        }
        else {
          if (Arch.Data < (char *)0x8) {
            return NoSubArch;
          }
          if (*(long *)(this + -8 + (long)Arch.Data) != 0x3561626d696c616b) {
            return NoSubArch;
          }
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x18';
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
          local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
        }
      }
      local_18.Storage.hasVal = true;
      pSVar3 = llvm::Optional<llvm::Triple::SubArchType>::getPointer(&local_18);
      SVar2 = *pSVar3;
    }
  }
  else {
    AVar1 = llvm::ARM::parseArch(Arch_00);
    SVar2 = NoSubArch;
    if (AVar1 - ARMV4T < 0x1b) {
      SVar2 = *(SubArchType *)(&DAT_0018c58c + (ulong)(AVar1 - ARMV4T) * 4);
    }
  }
  return SVar2;
}

Assistant:

static Triple::SubArchType parseSubArch(StringRef SubArchName) {
  StringRef ARMSubArch = ARM::getCanonicalArchName(SubArchName);

  // For now, this is the small part. Early return.
  if (ARMSubArch.empty())
    return StringSwitch<Triple::SubArchType>(SubArchName)
      .EndsWith("kalimba3", Triple::KalimbaSubArch_v3)
      .EndsWith("kalimba4", Triple::KalimbaSubArch_v4)
      .EndsWith("kalimba5", Triple::KalimbaSubArch_v5)
      .Default(Triple::NoSubArch);

  // ARM sub arch.
  switch(ARM::parseArch(ARMSubArch)) {
  case ARM::ArchKind::ARMV4:
    return Triple::NoSubArch;
  case ARM::ArchKind::ARMV4T:
    return Triple::ARMSubArch_v4t;
  case ARM::ArchKind::ARMV5T:
    return Triple::ARMSubArch_v5;
  case ARM::ArchKind::ARMV5TE:
  case ARM::ArchKind::IWMMXT:
  case ARM::ArchKind::IWMMXT2:
  case ARM::ArchKind::XSCALE:
  case ARM::ArchKind::ARMV5TEJ:
    return Triple::ARMSubArch_v5te;
  case ARM::ArchKind::ARMV6:
    return Triple::ARMSubArch_v6;
  case ARM::ArchKind::ARMV6K:
  case ARM::ArchKind::ARMV6KZ:
    return Triple::ARMSubArch_v6k;
  case ARM::ArchKind::ARMV6T2:
    return Triple::ARMSubArch_v6t2;
  case ARM::ArchKind::ARMV6M:
    return Triple::ARMSubArch_v6m;
  case ARM::ArchKind::ARMV7A:
  case ARM::ArchKind::ARMV7R:
    return Triple::ARMSubArch_v7;
  case ARM::ArchKind::ARMV7VE:
    return Triple::ARMSubArch_v7ve;
  case ARM::ArchKind::ARMV7K:
    return Triple::ARMSubArch_v7k;
  case ARM::ArchKind::ARMV7M:
    return Triple::ARMSubArch_v7m;
  case ARM::ArchKind::ARMV7S:
    return Triple::ARMSubArch_v7s;
  case ARM::ArchKind::ARMV7EM:
    return Triple::ARMSubArch_v7em;
  case ARM::ArchKind::ARMV8A:
    return Triple::ARMSubArch_v8;
  case ARM::ArchKind::ARMV8_1A:
    return Triple::ARMSubArch_v8_1a;
  case ARM::ArchKind::ARMV8_2A:
    return Triple::ARMSubArch_v8_2a;
  case ARM::ArchKind::ARMV8_3A:
    return Triple::ARMSubArch_v8_3a;
  case ARM::ArchKind::ARMV8_4A:
    return Triple::ARMSubArch_v8_4a;
  case ARM::ArchKind::ARMV8R:
    return Triple::ARMSubArch_v8r;
  case ARM::ArchKind::ARMV8MBaseline:
    return Triple::ARMSubArch_v8m_baseline;
  case ARM::ArchKind::ARMV8MMainline:
    return Triple::ARMSubArch_v8m_mainline;
  default:
    return Triple::NoSubArch;
  }
}